

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::TexImageCubeAlignCase::createTexture(TexImageCubeAlignCase *this)

{
  ContextWrapper *this_00;
  uint uVar1;
  int rowPitch;
  uint uVar2;
  long lVar3;
  int rowLen;
  uint uVar4;
  ulong uVar5;
  int height;
  ulong uVar6;
  int ndx;
  int level;
  int local_ac;
  deUint32 tex;
  TextureFormat fmt;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  Vec4 local_78;
  Vec4 local_68;
  PixelBufferAccess local_58;
  
  fmt = (this->super_TextureSpecCase).m_texFormat;
  if (((this->super_TextureSpecCase).m_flags & 1) == 0) {
    local_ac = 1;
  }
  else {
    uVar4 = (this->super_TextureSpecCase).m_width;
    uVar1 = 0x20;
    uVar2 = uVar1;
    if (uVar4 != 0) {
      uVar2 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> uVar2 == 0; uVar2 = uVar2 - 1) {
        }
      }
      uVar2 = uVar2 ^ 0x1f;
    }
    uVar4 = (this->super_TextureSpecCase).m_height;
    if (uVar4 != 0) {
      uVar1 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      uVar1 = uVar1 ^ 0x1f;
    }
    local_ac = 0x1f - uVar1;
    if ((int)(0x1f - uVar1) < (int)(0x1f - uVar2)) {
      local_ac = 0x1f - uVar2;
    }
    local_ac = local_ac + 1;
  }
  tex = 0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &(this->super_TextureSpecCase).super_ContextWrapper;
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0x8513,tex);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,this->m_alignment);
  for (level = 0; level != local_ac; level = level + 1) {
    uVar4 = (this->super_TextureSpecCase).m_width >> ((byte)level & 0x1f);
    uVar5 = (ulong)uVar4;
    if ((int)uVar4 < 2) {
      uVar5 = 1;
    }
    uVar4 = (this->super_TextureSpecCase).m_height >> ((byte)level & 0x1f);
    uVar6 = (ulong)uVar4;
    if ((int)uVar4 < 2) {
      uVar6 = 1;
    }
    rowLen = (int)uVar5;
    rowPitch = getRowPitch(&fmt,rowLen,this->m_alignment);
    uVar2 = (uint)(uVar5 >> 2);
    height = (int)uVar6;
    uVar4 = (uint)(uVar6 >> 2);
    if (uVar2 < uVar4) {
      uVar4 = uVar2;
    }
    local_68.m_data[0] = 1.0;
    local_68.m_data[1] = 0.0;
    local_68.m_data[2] = 0.0;
    local_68.m_data[3] = 1.0;
    local_78.m_data[0] = 0.0;
    local_78.m_data[1] = 1.0;
    local_78.m_data[2] = 0.0;
    local_78.m_data[3] = 1.0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&data,(long)(rowPitch * height));
    tcu::PixelBufferAccess::PixelBufferAccess
              (&local_58,&fmt,rowLen,height,1,rowPitch,0,
               data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start);
    tcu::fillWithGrid(&local_58,uVar4 + (uVar4 == 0),&local_68,&local_78);
    for (lVar3 = 0; lVar3 != 0x18; lVar3 = lVar3 + 4) {
      sglr::ContextWrapper::glTexImage2D
                (this_00,*(deUint32 *)((long)&s_cubeMapFaces + lVar3),level,this->m_format,rowLen,
                 height,0,this->m_format,this->m_dataType,
                 data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start);
    }
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

void createTexture (void)
	{
		tcu::TextureFormat	fmt			= m_texFormat;
		int					numLevels	= (m_flags & MIPMAPS) ? de::max(deLog2Floor32(m_width), deLog2Floor32(m_height))+1 : 1;
		deUint32			tex			= 0;
		vector<deUint8>		data;

		DE_ASSERT(m_width == m_height); // Non-square cubemaps are not supported by GLES2.

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_CUBE_MAP, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, m_alignment);

		for (int ndx = 0; ndx < numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width >> ndx);
			int		levelH		= de::max(1, m_height >> ndx);
			int		rowPitch	= getRowPitch(fmt, levelW, m_alignment);
			Vec4	colorA		(1.0f, 0.0f, 0.0f, 1.0f);
			Vec4	colorB		(0.0f, 1.0f, 0.0f, 1.0f);
			int		cellSize	= de::max(1, de::min(levelW >> 2, levelH >> 2));

			data.resize(rowPitch*levelH);
			tcu::fillWithGrid(tcu::PixelBufferAccess(fmt, levelW, levelH, 1, rowPitch, 0, &data[0]), cellSize, colorA, colorB);

			for (int face = 0; face < DE_LENGTH_OF_ARRAY(s_cubeMapFaces); face++)
				glTexImage2D(s_cubeMapFaces[face], ndx, m_format, levelW, levelH, 0, m_format, m_dataType, &data[0]);
		}
	}